

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lacassagne_2016_code.inc.h
# Opt level: O2

void __thiscall LSL_STD<TTA>::FirstScan(LSL_STD<TTA> *this)

{
  uint uVar1;
  uint uVar2;
  Mat1b *pMVar3;
  uint *puVar4;
  uint **ppuVar5;
  uint *puVar6;
  uint *puVar7;
  uint *puVar8;
  int iVar9;
  ulong uVar10;
  int *piVar11;
  ulong uVar12;
  ulong uVar13;
  int er_1;
  uint uVar14;
  long lVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  int er;
  long lVar19;
  bool bVar20;
  
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  uVar1 = *(uint *)&pMVar3->field_0x8;
  uVar2 = *(uint *)&pMVar3->field_0xc;
  uVar10 = 0;
  uVar12 = 0;
  if (0 < (int)uVar2) {
    uVar12 = (ulong)uVar2;
  }
  uVar13 = 0;
  if (0 < (int)uVar1) {
    uVar13 = (ulong)uVar1;
  }
  for (; uVar10 != uVar13; uVar10 = uVar10 + 1) {
    pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    puVar4 = (this->ER).prows[uVar10];
    ppuVar5 = (this->RLC).prows;
    puVar6 = ppuVar5[uVar10];
    lVar19 = **(long **)&pMVar3->field_0x48;
    lVar15 = *(long *)&pMVar3->field_0x10;
    uVar17 = 0;
    uVar16 = 0;
    uVar14 = 0;
    for (uVar18 = 0; uVar12 != uVar18; uVar18 = uVar18 + 1) {
      bVar20 = *(char *)(lVar19 * uVar10 + lVar15 + uVar18) != '\0';
      uVar14 = uVar14 ^ bVar20;
      puVar6[uVar17] = (int)uVar18 - uVar16;
      uVar16 = uVar16 ^ uVar14;
      uVar17 = uVar17 + uVar14;
      puVar4[uVar18] = uVar17;
      uVar14 = (uint)bVar20;
    }
    puVar6[uVar17] = uVar2 - uVar16;
    this->ner[uVar10] = uVar14 + uVar17;
    ppuVar5[uVar10 + 1] = puVar6 + (ulong)(uVar14 + uVar17) + 1;
  }
  *TTA::rtable_ = 0;
  TTA::length_ = 1;
  memset(*(this->ERA).prows,0,(long)(int)((uVar2 + 1) * uVar1) << 2);
  puVar4 = *(this->ERA).prows;
  for (lVar19 = 1; piVar11 = this->ner, lVar19 <= *piVar11; lVar19 = lVar19 + 2) {
    uVar14 = TTA::NewLabel();
    puVar4[lVar19] = uVar14;
  }
  for (lVar19 = 1; lVar19 < (int)uVar1; lVar19 = lVar19 + 1) {
    ppuVar5 = (this->ERA).prows;
    puVar4 = ppuVar5[lVar19 + -1];
    puVar6 = ppuVar5[lVar19];
    puVar7 = (this->ER).prows[lVar19 + -1];
    puVar8 = (this->RLC).prows[lVar19];
    for (lVar15 = 1; lVar15 <= piVar11[lVar19]; lVar15 = lVar15 + 2) {
      uVar14 = puVar8[lVar15 + -1];
      uVar16 = puVar8[lVar15];
      uVar16 = puVar7[(int)(((int)uVar16 < (int)(uVar2 - 1)) + uVar16)];
      uVar10 = (long)(int)puVar7[(int)(uVar14 - (0 < (int)uVar14))] | 1;
      iVar9 = uVar16 + (uVar16 & 1) + -1;
      if (iVar9 < (int)uVar10) {
        uVar14 = TTA::NewLabel();
      }
      else {
        uVar14 = TTA::rtable_[puVar4[uVar10]];
        while (uVar12 = uVar10 + 2, (long)uVar12 <= (long)iVar9) {
          uVar16 = TTA::rtable_[puVar4[uVar10 + 2]];
          if ((int)uVar14 < (int)uVar16) {
            TTA::UpdateTable(uVar16,uVar14);
          }
          uVar10 = uVar12;
          if ((int)uVar16 < (int)uVar14) {
            TTA::UpdateTable(uVar14,uVar16);
            uVar14 = uVar16;
          }
        }
      }
      puVar6[lVar15] = uVar14;
      piVar11 = this->ner;
    }
  }
  return;
}

Assistant:

void FirstScan()
    {
        int rows = img_.rows;
        int cols = img_.cols;

        // Step 1
        for (int r = 0; r < rows; ++r) {
            // Get pointers to rows
            const unsigned char* img_r = img_.ptr<unsigned char>(r);
            unsigned* ER_r = ER.prows[r];
            unsigned* RLC_r = RLC.prows[r];
            int x0;
            int x1 = 0; // Previous value of X
            int f = 0;  // Front detection
            ZOA_MOD0
            int er = 0;
            for (int c = 0; c < cols; ++c) {
                x0 = img_r[c] > 0;
                f = x0 ^ x1;
                RLE_MOD1{
                    RLC_r[er] = c ZOA_MOD1;
                    ZOA_MOD2
                        er = er + RLE_MOD2;
                }
                ER_r[c] = er;
                x1 = x0;
            }
            ZOA_MOD3
                RLC_r[er] = cols ZOA_MOD1;
            ZOA_MOD4
                ner[r] = er;
            // Compact RLC usage
            RLC.prows[r + 1] = RLC_r + er + 1;
        }